

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::StreamingReporterBase::testGroupEnded(StreamingReporterBase *this,TestGroupStats *param_1)

{
  TestGroupStats *param_1_local;
  StreamingReporterBase *this_local;
  
  LazyStat<Catch::GroupInfo>::reset(&this->currentGroupInfo);
  return;
}

Assistant:

virtual void testGroupEnded( TestGroupStats const& /* _testGroupStats */ ) {
            currentGroupInfo.reset();
        }